

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetActionHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ahI,Index t,Index *aIs)

{
  pointer pvVar1;
  long lVar2;
  undefined1 auVar3 [16];
  Index IVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var_00 [56];
  
  auVar10 = in_ZMM0._0_16_;
  uVar6 = (ulong)agentI;
  pvVar1 = (this->_m_firstAHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_firstAHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar8 = uVar6;
  if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
    uVar8 = (ulong)t;
    lVar2 = *(long *)&pvVar1[uVar6].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data;
    if (uVar8 < (ulong)((long)pvVar1[uVar6].
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 3)) {
      IVar4 = Globals::CastLIndexToIndex(*(LIndex *)(lVar2 + uVar8 * 8));
      iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
      if (t != 0) {
        uVar9 = ahI - IVar4;
        auVar10 = vcvtusi2sd_avx512f(auVar10,CONCAT44(extraout_var,iVar5));
        iVar5 = t - 1;
        uVar7 = 0;
        do {
          auVar3 = vcvtusi2sd_avx512f(in_XMM2,iVar5);
          auVar11._0_8_ = pow(auVar10._0_8_,auVar3._0_8_);
          auVar11._8_56_ = extraout_var_00;
          uVar6 = vcvttsd2usi_avx512f(auVar11._0_16_);
          IVar4 = (Index)(uVar9 / uVar6);
          aIs[uVar7] = IVar4;
          uVar9 = uVar9 - (int)uVar6 * IVar4;
          uVar7 = uVar7 + 1;
          iVar5 = iVar5 + -1;
        } while (uVar8 != uVar7);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionHistoryArrays
    (Index agentI, Index ahI, Index t,  Index aIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //action-histories.
    Index ahIwithinThisT = ahI - CastLIndexToIndex(_m_firstAHIforT.at(agentI).at(t));
   
    Index remainder = ahIwithinThisT;
    size_t vec_size = t; // the number of joint actions we are searching
    size_t nrA = GetNrActions(agentI);
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionActionHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrA, (double)(stage));
        Index aI_t2 = remainder / b;
        aIs[t2] = aI_t2; 
        remainder -= aI_t2 * b;
    }
}